

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O0

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddVariable
          (InstructionBuilder *this,uint32_t type_id,uint32_t storage_class)

{
  initializer_list<unsigned_int> init_list;
  uint32_t ty_id;
  uint32_t res_id;
  Instruction *pIVar1;
  IRContext *c;
  IRContext *this_00;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_a8;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> new_inst;
  SmallVector<unsigned_int,_2UL> local_88;
  Operand local_60;
  undefined1 local_30 [8];
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> operands;
  uint32_t storage_class_local;
  uint32_t type_id_local;
  InstructionBuilder *this_local;
  
  operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = storage_class;
  operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = type_id;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_30);
  new_inst._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ =
       (uint32_t)
       operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  init_list._M_len = 1;
  init_list._M_array =
       (iterator)
       ((long)&new_inst._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl + 4);
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88,init_list);
  Operand::Operand(&local_60,SPV_OPERAND_TYPE_ID,&local_88);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_30,
             &local_60);
  Operand::~Operand(&local_60);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_88);
  pIVar1 = (Instruction *)operator_new(0x70);
  c = GetContext(this);
  ty_id = operands.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  this_00 = GetContext(this);
  res_id = IRContext::TakeNextId(this_00);
  Instruction::Instruction(pIVar1,c,OpVariable,ty_id,res_id,(OperandList *)local_30);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_a8,pIVar1);
  pIVar1 = AddInstruction(this,&local_a8);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_a8);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_30);
  return pIVar1;
}

Assistant:

Instruction* AddVariable(uint32_t type_id, uint32_t storage_class) {
    std::vector<Operand> operands;
    operands.push_back({SPV_OPERAND_TYPE_ID, {storage_class}});
    std::unique_ptr<Instruction> new_inst(
        new Instruction(GetContext(), spv::Op::OpVariable, type_id,
                        GetContext()->TakeNextId(), operands));
    return AddInstruction(std::move(new_inst));
  }